

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

float __thiscall irr::CIrrDeviceSDL::getDisplayDensity(CIrrDeviceSDL *this)

{
  float *pfVar1;
  long in_RDI;
  float dpi_h;
  float dpi_w;
  int drawable_h;
  int drawable_w;
  int window_h;
  int window_w;
  float local_28;
  float local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14 [4];
  float local_4;
  
  if (*(long *)(in_RDI + 0xf8) == 0) {
    local_4 = 0.0;
  }
  else {
    SDL_GetWindowSize(*(undefined8 *)(in_RDI + 0xf8),local_14,&local_18);
    SDL_GL_GetDrawableSize(*(undefined8 *)(in_RDI + 0xf8),&local_1c,&local_20);
    local_24 = ((float)local_1c / (float)local_14[0]) * 96.0;
    local_28 = ((float)local_20 / (float)local_18) * 96.0;
    pfVar1 = ::std::max<float>(&local_24,&local_28);
    local_4 = *pfVar1;
  }
  return local_4;
}

Assistant:

float CIrrDeviceSDL::getDisplayDensity() const
{
	if (!Window)
		return 0.0f;

	int window_w;
	int window_h;
	SDL_GetWindowSize(Window, &window_w, &window_h);

	int drawable_w;
	int drawable_h;
	SDL_GL_GetDrawableSize(Window, &drawable_w, &drawable_h);

	// assume 96 dpi
	float dpi_w = (float)drawable_w / (float)window_w * 96.0f;
	float dpi_h = (float)drawable_h / (float)window_h * 96.0f;

	return std::max(dpi_w, dpi_h);
}